

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

void writeTiled(TiledOutputPart *out,
               vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *buf,
               vector<double,_std::allocator<double>_> *perf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int xLevel;
  int iVar7;
  int iVar8;
  int yLevel;
  double local_38;
  
  Imf_3_4::TiledOutputPart::header();
  lVar5 = Imf_3_4::Header::tileDescription();
  iVar1 = *(int *)(lVar5 + 8);
  iVar7 = 0;
  lVar5 = std::chrono::_V2::steady_clock::now();
  while( true ) {
    iVar2 = Imf_3_4::TiledOutputPart::numXLevels();
    if (iVar2 <= iVar7) break;
    iVar2 = 0;
    while( true ) {
      iVar3 = Imf_3_4::TiledOutputPart::numYLevels();
      if (iVar3 <= iVar2) break;
      if (iVar7 == iVar2 || iVar1 == 2) {
        Imf_3_4::TiledOutputPart::setFrameBuffer((FrameBuffer *)out);
        iVar8 = (int)out;
        iVar3 = Imf_3_4::TiledOutputPart::numXTiles(iVar8);
        iVar4 = Imf_3_4::TiledOutputPart::numYTiles(iVar8);
        Imf_3_4::TiledOutputPart::writeTiles(iVar8,0,iVar3 + -1,0,iVar4 + -1,iVar7);
      }
      iVar2 = iVar2 + 1;
    }
    iVar7 = iVar7 + 1;
  }
  if (perf != (vector<double,_std::allocator<double>_> *)0x0) {
    lVar6 = std::chrono::_V2::steady_clock::now();
    local_38 = (double)(lVar6 - lVar5) / 1000000000.0;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>(perf,&local_38);
  }
  return;
}

Assistant:

void
writeTiled (
    TiledOutputPart& out, vector<FrameBuffer>& buf, vector<double>* perf)
{
    int levelIndex = 0;

    TileDescription          tiling = out.header ().tileDescription ();
    steady_clock::time_point start  = steady_clock::now ();

    for (int xLevel = 0; xLevel < out.numXLevels (); ++xLevel)
    {
        for (int yLevel = 0; yLevel < out.numYLevels (); ++yLevel)
        {
            if (tiling.mode == RIPMAP_LEVELS || xLevel == yLevel)
            {
                out.setFrameBuffer (buf[levelIndex]);
                out.writeTiles (
                    0,
                    out.numXTiles (xLevel) - 1,
                    0,
                    out.numYTiles (yLevel) - 1,
                    xLevel,
                    yLevel);
                ++levelIndex;
            }
        }
    }
    if (perf)
    {
        steady_clock::time_point end = steady_clock::now ();
        perf->push_back (timing (start, end));
    }
}